

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

void xmlBufFree(xmlBufPtr buf)

{
  xmlChar *pxVar1;
  
  if (buf == (xmlBufPtr)0x0) {
    return;
  }
  if (buf->alloc == XML_BUFFER_ALLOC_IO) {
    pxVar1 = buf->contentIO;
    if ((pxVar1 == (xmlChar *)0x0) && (pxVar1 = buf->content, pxVar1 == (xmlChar *)0x0))
    goto LAB_00136843;
  }
  else {
    pxVar1 = buf->content;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE || pxVar1 == (xmlChar *)0x0) goto LAB_00136843;
  }
  (*xmlFree)(pxVar1);
LAB_00136843:
  (*xmlFree)(buf);
  return;
}

Assistant:

void
xmlBufFree(xmlBufPtr buf) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufFree: buf == NULL\n");
#endif
	return;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->contentIO != NULL)) {
        xmlFree(buf->contentIO);
    } else if ((buf->content != NULL) &&
        (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
        xmlFree(buf->content);
    }
    xmlFree(buf);
}